

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ArgBuilder __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::operator[](CommandLine<Catch::ConfigData> *this)

{
  pointer pAVar1;
  logic_error *this_00;
  Arg *this_01;
  CommandLine<Catch::ConfigData> *this_local;
  ArgBuilder local_10;
  ArgBuilder builder;
  
  pAVar1 = std::
           unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ::get(&this->m_floatingArg);
  if (pAVar1 != (pointer)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Only one unpositional argument can be added");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_01 = (Arg *)operator_new(0xa8);
  Arg::Arg(this_01);
  std::
  unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::reset(&this->m_floatingArg,this_01);
  pAVar1 = std::
           unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ::get(&this->m_floatingArg);
  ArgBuilder::ArgBuilder(&local_10,pAVar1);
  return (ArgBuilder)local_10.m_arg;
}

Assistant:

ArgBuilder operator[](UnpositionalTag) {
			if (m_floatingArg.get())
				throw std::logic_error("Only one unpositional argument can be added");
			m_floatingArg.reset(new Arg());
			ArgBuilder builder(m_floatingArg.get());
			return builder;
		}